

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uttt.h
# Opt level: O1

vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> * __thiscall
uttt::IBoardReader::operator()
          (vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__return_storage_ptr__,
          IBoardReader *this,vector<char,_std::allocator<char>_> *bytes)

{
  uint uVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pIVar4;
  ulong uVar5;
  ulong uVar6;
  allocator_type local_19;
  
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            (__return_storage_ptr__,
             (ulong)((long)(bytes->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(bytes->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_start) / 0x18,&local_19);
  pcVar2 = (bytes->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar3 = (bytes->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pcVar3 != pcVar2) {
    pIVar4 = (__return_storage_ptr__->
             super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      uVar6 = uVar5 / 0x18;
      uVar1 = *(uint *)(pcVar2 + uVar5);
      pIVar4[uVar6].macro =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      pIVar4[uVar6].micro._M_elems[0] =
           *(ushort *)(pcVar2 + uVar5 + 4) << 8 | *(ushort *)(pcVar2 + uVar5 + 4) >> 8;
      pIVar4[uVar6].micro._M_elems[1] =
           *(ushort *)(pcVar2 + uVar5 + 6) << 8 | *(ushort *)(pcVar2 + uVar5 + 6) >> 8;
      pIVar4[uVar6].micro._M_elems[2] =
           *(ushort *)(pcVar2 + uVar5 + 8) << 8 | *(ushort *)(pcVar2 + uVar5 + 8) >> 8;
      pIVar4[uVar6].micro._M_elems[3] =
           *(ushort *)(pcVar2 + uVar5 + 10) << 8 | *(ushort *)(pcVar2 + uVar5 + 10) >> 8;
      pIVar4[uVar6].micro._M_elems[4] =
           *(ushort *)(pcVar2 + uVar5 + 0xc) << 8 | *(ushort *)(pcVar2 + uVar5 + 0xc) >> 8;
      pIVar4[uVar6].micro._M_elems[5] =
           *(ushort *)(pcVar2 + uVar5 + 0xe) << 8 | *(ushort *)(pcVar2 + uVar5 + 0xe) >> 8;
      pIVar4[uVar6].micro._M_elems[6] =
           *(ushort *)(pcVar2 + uVar5 + 0x10) << 8 | *(ushort *)(pcVar2 + uVar5 + 0x10) >> 8;
      pIVar4[uVar6].micro._M_elems[7] =
           *(ushort *)(pcVar2 + uVar5 + 0x12) << 8 | *(ushort *)(pcVar2 + uVar5 + 0x12) >> 8;
      pIVar4[uVar6].micro._M_elems[8] =
           *(ushort *)(pcVar2 + uVar5 + 0x14) << 8 | *(ushort *)(pcVar2 + uVar5 + 0x14) >> 8;
      pIVar4[uVar6].next = pcVar2[uVar5 + 0x16];
      pIVar4[uVar6].player = pcVar2[uVar5 + 0x17];
      uVar5 = uVar5 + 0x18;
    } while (uVar5 < (ulong)((long)pcVar3 - (long)pcVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IBoard> operator()(const std::vector<char> &bytes) const
    {
        std::vector<IBoard> boards(bytes.size() / IBoardSize);
        for (unsigned long long offset = 0; offset < bytes.size(); offset += IBoardSize)
        {
            auto &b = boards[offset / IBoardSize];
            auto it = &bytes[offset];
            b.macro = (uint8_t(it[0]) << 24) | (uint8_t(it[1]) << 16) | (uint8_t(it[2]) << 8) | uint8_t(it[3]);
            b.micro[0] = (uint8_t(it[4]) << 8) | uint8_t(it[5]);
            b.micro[1] = (uint8_t(it[6]) << 8) | uint8_t(it[7]);
            b.micro[2] = (uint8_t(it[8]) << 8) | uint8_t(it[9]);
            b.micro[3] = (uint8_t(it[10]) << 8) | uint8_t(it[11]);
            b.micro[4] = (uint8_t(it[12]) << 8) | uint8_t(it[13]);
            b.micro[5] = (uint8_t(it[14]) << 8) | uint8_t(it[15]);
            b.micro[6] = (uint8_t(it[16]) << 8) | uint8_t(it[17]);
            b.micro[7] = (uint8_t(it[18]) << 8) | uint8_t(it[19]);
            b.micro[8] = (uint8_t(it[20]) << 8) | uint8_t(it[21]);
            b.next = it[22];
            b.player = it[23];
        }
        return boards;
    }